

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-solver-c.cc
# Opt level: O0

int NLW2_SolveFeederHandler_C
              (NLW2_NLSolver_C *pnls,NLW2_NLFeeder_C *nlf_c,NLW2_SOLHandler_C *solh_c,char *solver,
              char *solver_opts)

{
  bool bVar1;
  bool bVar2;
  NLW2_SOLHandler_C_Impl solh;
  NLW2_NLFeeder_C_Impl nlf;
  NLW2_NLFeeder_C *in_stack_fffffffffffffe08;
  undefined6 in_stack_fffffffffffffe10;
  undefined1 in_stack_fffffffffffffe16;
  undefined1 in_stack_fffffffffffffe17;
  undefined4 in_stack_fffffffffffffe40;
  undefined1 uVar3;
  byte bVar4;
  byte bVar5;
  allocator<char> in_stack_fffffffffffffe47;
  char *in_stack_fffffffffffffe48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe50;
  NLW2_NLFeeder_C_Impl *in_stack_fffffffffffffe70;
  undefined6 in_stack_fffffffffffffe78;
  undefined1 in_stack_fffffffffffffe7e;
  byte bVar6;
  allocator<char> in_stack_fffffffffffffe7f;
  string local_180 [32];
  NLW2_SOLHandler_C_Impl *in_stack_fffffffffffffea0;
  NLSolver *in_stack_fffffffffffffea8;
  string *in_stack_fffffffffffffef8;
  string *in_stack_ffffffffffffff00;
  NLSolver *in_stack_ffffffffffffff08;
  
  mp::NLW2_NLFeeder_C_Impl::NLW2_NLFeeder_C_Impl
            ((NLW2_NLFeeder_C_Impl *)
             CONCAT17(in_stack_fffffffffffffe17,
                      CONCAT16(in_stack_fffffffffffffe16,in_stack_fffffffffffffe10)),
             in_stack_fffffffffffffe08);
  mp::NLW2_SOLHandler_C_Impl::NLW2_SOLHandler_C_Impl
            ((NLW2_SOLHandler_C_Impl *)
             CONCAT17(in_stack_fffffffffffffe17,
                      CONCAT16(in_stack_fffffffffffffe16,in_stack_fffffffffffffe10)),
             (NLW2_SOLHandler_C *)in_stack_fffffffffffffe08);
  bVar2 = mp::NLSolver::LoadModel<mp::NLW2_NLFeeder_C_Impl>
                    ((NLSolver *)
                     CONCAT17(in_stack_fffffffffffffe7f,
                              CONCAT16(in_stack_fffffffffffffe7e,in_stack_fffffffffffffe78)),
                     in_stack_fffffffffffffe70);
  bVar6 = 0;
  bVar1 = false;
  bVar5 = 0;
  bVar4 = 0;
  uVar3 = false;
  if (bVar2) {
    std::allocator<char>::allocator();
    bVar6 = 1;
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
               (allocator<char> *)
               CONCAT17(in_stack_fffffffffffffe47,
                        CONCAT16(bVar5,CONCAT15(bVar4,CONCAT14(uVar3,in_stack_fffffffffffffe40)))));
    bVar1 = true;
    std::allocator<char>::allocator();
    bVar5 = 1;
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
               (allocator<char> *)
               CONCAT17(in_stack_fffffffffffffe47,
                        CONCAT16(1,CONCAT15(bVar4,CONCAT14(uVar3,in_stack_fffffffffffffe40)))));
    bVar4 = 1;
    bVar2 = mp::NLSolver::Solve(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
                                in_stack_fffffffffffffef8);
    uVar3 = false;
    if (bVar2) {
      uVar3 = mp::NLSolver::ReadSolution<mp::NLW2_SOLHandler_C_Impl>
                        (in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
    }
  }
  if ((bVar4 & 1) != 0) {
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffe48);
  }
  if ((bVar5 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffe47);
  }
  if (bVar1) {
    std::__cxx11::string::~string(local_180);
  }
  if ((bVar6 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffe7f);
  }
  return (uint)(byte)uVar3;
}

Assistant:

int NLW2_SolveFeederHandler_C(NLW2_NLSolver_C* pnls,
                              NLW2_NLFeeder_C* nlf_c,
                              NLW2_SOLHandler_C* solh_c,
                              const char* solver,
                              const char* solver_opts) {
  mp::NLW2_NLFeeder_C_Impl nlf(nlf_c);
  mp::NLW2_SOLHandler_C_Impl solh(solh_c);
  return ((mp::NLSOL_C_Impl*)(pnls->p_nlsol_))
      ->LoadModel(nlf)
      && ((mp::NLSOL_C_Impl*)(pnls->p_nlsol_))
      ->Solve(solver, solver_opts)
      && ((mp::NLSOL_C_Impl*)(pnls->p_nlsol_))
      ->ReadSolution(solh);
}